

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

PackedStructNode * __thiscall
kratos::PackedStructGraph::add_node(PackedStructGraph *this,PackedStruct *s)

{
  iterator iVar1;
  mapped_type *pmVar2;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view format_str;
  undefined1 local_68 [8];
  PackedStructNode node;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&s->struct_name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_true>
      ._M_cur == (__node_type *)0x0) {
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&node.children
    ;
    local_68 = (undefined1  [8])0x0;
    node.children._M_t._M_impl._0_4_ = 0;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    node.parent = (PackedStructNode *)s;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::PackedStructNode>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStructNode>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,kratos::PackedStructNode&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::PackedStructNode>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStructNode>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this,s,local_68);
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,&s->struct_name);
    std::
    _Rb_tree<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::_Identity<kratos::PackedStructNode_*>,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
    ::~_Rb_tree((_Rb_tree<kratos::PackedStructNode_*,_kratos::PackedStructNode_*,_std::_Identity<kratos::PackedStructNode_*>,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                 *)&node.struct_);
    return pmVar2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  node.children._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(s->struct_name)._M_dataplus._M_p;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} already in graph");
  format_str.data_ = (char *)bVar3.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&node.children._M_t._M_impl.super__Rb_tree_header._M_node_count;
  format_str.size_ = 0xd;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_68,(detail *)bVar3.data_,format_str,args);
  InternalException::InternalException(this_00,(string *)local_68);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedStructNode *PackedStructGraph::add_node(const PackedStruct *s) {
    if (nodes_.find(s->struct_name) != nodes_.end()) {
        throw InternalException(::format("{0} already in graph", s->struct_name));
    }

    PackedStructNode node;
    node.struct_ = s;
    nodes_.emplace(s->struct_name, node);
    return &nodes_.at(s->struct_name);
}